

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

bool Cmd::isUnsupportedTerm(void)

{
  char *__s;
  bool bVar1;
  char *__s_00;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  string_view a;
  string_view b;
  
  __s_00 = getenv("TERM");
  if (__s_00 == (char *)0x0) {
    bVar4 = false;
  }
  else {
    lVar5 = 0;
    do {
      bVar4 = lVar5 != 0x18;
      if (lVar5 == 0x18) {
        return bVar4;
      }
      __s = *(char **)((long)isUnsupportedTerm::unsupported_terms + lVar5);
      sVar2 = strlen(__s_00);
      sVar3 = strlen(__s);
      a._M_str = __s_00;
      a._M_len = sVar2;
      b._M_str = __s;
      b._M_len = sVar3;
      bVar1 = iequals(a,b);
      lVar5 = lVar5 + 8;
    } while (!bVar1);
  }
  return bVar4;
}

Assistant:

static bool isUnsupportedTerm() {

		const char *term = getenv("TERM");
		if (!term) {
			return false;
		}

		static const char *unsupported_terms[] = {"dumb", "cons25", "emacs"};
		for (const char *t : unsupported_terms) {
			if (iequals(term, t)) {
				return true;
			}
		}

		return false;
	}